

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask5_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 5 | uVar2;
  *out = uVar2;
  uVar2 = in[2] << 10 | uVar2;
  *out = uVar2;
  uVar2 = in[3] << 0xf | uVar2;
  *out = uVar2;
  uVar2 = in[4] << 0x14 | uVar2;
  *out = uVar2;
  uVar2 = in[5] << 0x19 | uVar2;
  *out = uVar2;
  uVar1 = in[6];
  *out = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[1] = uVar1;
  uVar1 = in[7] << 3 | uVar1;
  out[1] = uVar1;
  uVar1 = in[8] << 8 | uVar1;
  out[1] = uVar1;
  uVar1 = in[9] << 0xd | uVar1;
  out[1] = uVar1;
  uVar1 = in[10] << 0x12 | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xb] << 0x17 | uVar1;
  out[1] = uVar1;
  uVar2 = in[0xc];
  out[1] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[2] = uVar2;
  uVar2 = in[0xd] * 2 | uVar2;
  out[2] = uVar2;
  uVar2 = in[0xe] << 6 | uVar2;
  out[2] = uVar2;
  uVar2 = in[0xf] << 0xb | uVar2;
  out[2] = uVar2;
  uVar2 = in[0x10] << 0x10 | uVar2;
  out[2] = uVar2;
  uVar2 = in[0x11] << 0x15 | uVar2;
  out[2] = uVar2;
  uVar2 = in[0x12] << 0x1a | uVar2;
  out[2] = uVar2;
  uVar1 = in[0x13];
  out[2] = uVar1 << 0x1f | uVar2;
  uVar1 = uVar1 >> 1;
  out[3] = uVar1;
  uVar1 = in[0x14] << 4 | uVar1;
  out[3] = uVar1;
  uVar1 = in[0x15] << 9 | uVar1;
  out[3] = uVar1;
  uVar1 = in[0x16] << 0xe | uVar1;
  out[3] = uVar1;
  out[3] = in[0x17] << 0x13 | uVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask5_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (5 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 23;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (5 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 26;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (5 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 19;
  ++in;

  return out + 1;
}